

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void ARM_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  long lVar4;
  ulong uVar5;
  cs_detail *pcVar6;
  long lVar7;
  
  if (*(int *)(ud + 0x68) != 3) {
    return;
  }
  if ((mci->writeback == false) && (pcVar3 = strrchr(insn_asm,0x21), pcVar3 == (char *)0x0)) {
    uVar1 = mci->Opcode;
    if ((mci->csh->mode & CS_MODE_MICRO) != CS_MODE_ARM) {
      if ((0x3c < uVar1 - 0x92f) ||
         ((0x1818181818303333U >> ((ulong)(uVar1 - 0x92f) & 0x3f) & 1) == 0)) {
        uVar1 = uVar1 - 0xa0e;
        if (uVar1 < 0x31) {
          uVar5 = 0x183030c003333;
          goto LAB_00159f4e;
        }
        goto LAB_00159f5f;
      }
      goto LAB_00159f54;
    }
    if ((uVar1 - 0x80 < 0x3d) && ((0x118c0c0604803333U >> ((ulong)(uVar1 - 0x80) & 0x3f) & 1) != 0))
    goto LAB_00159f54;
    uVar1 = uVar1 - 0x180;
    if (uVar1 < 0x39) {
      uVar5 = 0x10c060120003333;
LAB_00159f4e:
      if ((uVar5 >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_00159f54;
    }
  }
  else {
LAB_00159f54:
    (insn->detail->field_6).arm.writeback = true;
  }
LAB_00159f5f:
  pcVar6 = insn->detail;
  if ((pcVar6->field_6).arm.update_flags == false) {
    uVar1 = insn->id;
    for (lVar7 = 8; lVar7 != 0x1c8; lVar7 = lVar7 + 0x10) {
      if (uVar1 == *(uint *)(&UNK_0028c7c8 + lVar7)) {
        pcVar3 = *(char **)((long)&insn_update_flgs[0].id + lVar7);
        __n = strlen(pcVar3);
        iVar2 = strncmp(insn_asm,pcVar3,__n);
        if (iVar2 == 0) {
          (pcVar6->field_6).arm.update_flags = true;
          pcVar6 = insn->detail;
          lVar7 = 0xd;
          goto LAB_0015a047;
        }
      }
    }
  }
LAB_00159fc2:
  if ((pcVar6->field_6).arm64.operands[0].shift.type == ARM64_SFT_INVALID) {
    (pcVar6->field_6).arm64.operands[0].shift.type = 0xf;
  }
  if (mci->Opcode == 0xd6) {
    *(undefined4 *)&(insn->detail->field_6).x86.operands[0].field_0x4 = 1;
    (insn->detail->field_6).x86.operands[0].field_1.reg = X86_REG_CS;
    *(undefined4 *)&(insn->detail->field_6).x86.operands[0].field_0x2c = 1;
    (insn->detail->field_6).x86.operands[1].type = 10;
    (insn->detail->field_6).arm.op_count = '\x02';
  }
  return;
  while (lVar7 = lVar4 + 1, pcVar6->regs_read[lVar4] != '\0') {
LAB_0015a047:
    lVar4 = lVar7;
    if (lVar4 == 0x21) goto LAB_00159fc2;
  }
  pcVar6->regs_read[lVar4] = '\x03';
  pcVar6 = insn->detail;
  goto LAB_00159fc2;
}

Assistant:

void ARM_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// check if this insn requests write-back
	if (mci->writeback || (strrchr(insn_asm, '!')) != NULL) {
		insn->detail->arm.writeback = true;
	} else if (mci->csh->mode & CS_MODE_THUMB) {
		// handle some special instructions with writeback
		switch(mci->Opcode) {
			default:
				break;
			case ARM_t2LDC2L_PRE:
			case ARM_t2LDC2_PRE:
			case ARM_t2LDCL_PRE:
			case ARM_t2LDC_PRE:

			case ARM_t2LDRB_PRE:
			case ARM_t2LDRD_PRE:
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDR_PRE:

			case ARM_t2STC2L_PRE:
			case ARM_t2STC2_PRE:
			case ARM_t2STCL_PRE:
			case ARM_t2STC_PRE:

			case ARM_t2STRB_PRE:
			case ARM_t2STRD_PRE:
			case ARM_t2STRH_PRE:
			case ARM_t2STR_PRE:

			case ARM_t2LDC2L_POST:
			case ARM_t2LDC2_POST:
			case ARM_t2LDCL_POST:
			case ARM_t2LDC_POST:

			case ARM_t2LDRB_POST:
			case ARM_t2LDRD_POST:
			case ARM_t2LDRH_POST:
			case ARM_t2LDRSB_POST:
			case ARM_t2LDRSH_POST:
			case ARM_t2LDR_POST:

			case ARM_t2STC2L_POST:
			case ARM_t2STC2_POST:
			case ARM_t2STCL_POST:
			case ARM_t2STC_POST:

			case ARM_t2STRB_POST:
			case ARM_t2STRD_POST:
			case ARM_t2STRH_POST:
			case ARM_t2STR_POST:
				insn->detail->arm.writeback = true;
				break;
		}
	} else {	// ARM mode
		// handle some special instructions with writeback
		switch(mci->Opcode) {
			default:
				break;
			case ARM_LDC2L_PRE:
			case ARM_LDC2_PRE:
			case ARM_LDCL_PRE:
			case ARM_LDC_PRE:

			case ARM_LDRD_PRE:
			case ARM_LDRH_PRE:
			case ARM_LDRSB_PRE:
			case ARM_LDRSH_PRE:

			case ARM_STC2L_PRE:
			case ARM_STC2_PRE:
			case ARM_STCL_PRE:
			case ARM_STC_PRE:

			case ARM_STRD_PRE:
			case ARM_STRH_PRE:

			case ARM_LDC2L_POST:
			case ARM_LDC2_POST:
			case ARM_LDCL_POST:
			case ARM_LDC_POST:

			case ARM_LDRBT_POST:
			case ARM_LDRD_POST:
			case ARM_LDRH_POST:
			case ARM_LDRSB_POST:
			case ARM_LDRSH_POST:

			case ARM_STC2L_POST:
			case ARM_STC2_POST:
			case ARM_STCL_POST:
			case ARM_STC_POST:

			case ARM_STRBT_POST:
			case ARM_STRD_POST:
			case ARM_STRH_POST:

			case ARM_LDRB_POST_IMM:
			case ARM_LDR_POST_IMM:
			case ARM_STRB_POST_IMM:
			case ARM_STR_POST_IMM:

				insn->detail->arm.writeback = true;
				break;
		}
	}

	// check if this insn requests update flags
	if (insn->detail->arm.update_flags == false) {
		// some insn still update flags, regardless of tabgen info
		unsigned int i, j;

		for (i = 0; i < ARR_SIZE(insn_update_flgs); i++) {
			if (insn->id == insn_update_flgs[i].id &&
					!strncmp(insn_asm, insn_update_flgs[i].name,
						strlen(insn_update_flgs[i].name))) {
				insn->detail->arm.update_flags = true;
				// we have to update regs_write array as well
				for (j = 0; j < ARR_SIZE(insn->detail->regs_write); j++) {
					if (insn->detail->regs_write[j] == 0) {
						insn->detail->regs_write[j] = ARM_REG_CPSR;
						break;
					}
				}
				break;
			}
		}
	}

	// instruction should not have invalid CC
	if (insn->detail->arm.cc == ARM_CC_INVALID) {
		insn->detail->arm.cc = ARM_CC_AL;
	}

	// manual fix for some special instructions
	// printf(">>> id: %u, mcid: %u\n", insn->id, mci->Opcode);
	switch(mci->Opcode) {
		default:
			break;
		case ARM_MOVPCLR:
			insn->detail->arm.operands[0].type = ARM_OP_REG;
			insn->detail->arm.operands[0].reg = ARM_REG_PC;
			insn->detail->arm.operands[1].type = ARM_OP_REG;
			insn->detail->arm.operands[1].reg = ARM_REG_LR;
			insn->detail->arm.op_count = 2;
			break;
	}
}